

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O1

void handle_filter_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,
               RD_STATS *rd_stats_y,int mode_cost,int64_t best_rd,int64_t best_rd_so_far)

{
  int iVar1;
  MB_MODE_INFO *mbmi;
  bool bVar2;
  FILTER_INTRA_MODE FVar3;
  bool bVar4;
  int iVar5;
  uint8_t *__src;
  int discount_color_cost;
  long lVar6;
  FILTER_INTRA_MODE FVar7;
  RD_STATS rd_stats_y_fi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  TX_SIZE local_8a1;
  int64_t local_880;
  RD_STATS local_860;
  undefined1 local_838 [1024];
  undefined1 local_438 [1032];
  
  local_880 = best_rd_so_far;
  mbmi = *(x->e_mbd).mi;
  local_8a1 = mbmi->tx_size;
  __src = (x->txfm_search_info).blk_skip;
  iVar1 = ctx->num_4x4_blk;
  discount_color_cost = mode_cost;
  memcpy(local_438,__src,(long)iVar1);
  memcpy(local_838,(x->e_mbd).tx_type_map,(long)iVar1);
  (mbmi->filter_intra_mode_info).use_filter_intra = '\x01';
  bVar4 = false;
  FVar7 = '\0';
  FVar3 = '\0';
  do {
    (mbmi->filter_intra_mode_info).filter_intra_mode = FVar7;
    av1_pick_uniform_tx_size_type_yrd(cpi,x,&local_860,bsize,best_rd);
    iVar1 = local_860.rate;
    if (local_860.rate != 0x7fffffff) {
      iVar5 = intra_mode_info_cost_y(cpi,x,mbmi,bsize,mode_cost,discount_color_cost);
      lVar6 = local_860.dist * 0x80 + ((long)x->rdmult * (long)(iVar5 + iVar1) + 0x100 >> 9);
      bVar2 = best_rd < lVar6 / 2;
      if (lVar6 < local_880 && !bVar2) {
        local_8a1 = mbmi->tx_size;
        iVar1 = ctx->num_4x4_blk;
        memcpy(local_838,(x->e_mbd).tx_type_map,(long)iVar1);
        memcpy(local_438,__src,(long)iVar1);
        rd_stats_y->rate = local_860.rate;
        rd_stats_y->zero_rate = local_860.zero_rate;
        rd_stats_y->dist = local_860.dist;
        rd_stats_y->rdcost = local_860.rdcost;
        rd_stats_y->sse = local_860.sse;
        rd_stats_y->skip_txfm = local_860.skip_txfm;
        *(undefined7 *)&rd_stats_y->field_0x21 = local_860._33_7_;
        bVar4 = true;
        local_880 = lVar6;
        FVar3 = FVar7;
      }
      if (lVar6 != 0x7fffffffffffffff && bVar2) break;
    }
    FVar7 = FVar7 + '\x01';
  } while (FVar7 != '\x05');
  mbmi->tx_size = local_8a1;
  memcpy((x->e_mbd).tx_type_map,local_838,(long)ctx->num_4x4_blk);
  memcpy(__src,local_438,(long)ctx->num_4x4_blk);
  if (bVar4) {
    (mbmi->filter_intra_mode_info).use_filter_intra = '\x01';
    (mbmi->filter_intra_mode_info).filter_intra_mode = FVar3;
  }
  else {
    (mbmi->filter_intra_mode_info).use_filter_intra = '\0';
  }
  return;
}

Assistant:

static inline void handle_filter_intra_mode(const AV1_COMP *cpi, MACROBLOCK *x,
                                            BLOCK_SIZE bsize,
                                            const PICK_MODE_CONTEXT *ctx,
                                            RD_STATS *rd_stats_y, int mode_cost,
                                            int64_t best_rd,
                                            int64_t best_rd_so_far) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  assert(mbmi->mode == DC_PRED &&
         av1_filter_intra_allowed_bsize(&cpi->common, bsize));

  RD_STATS rd_stats_y_fi;
  int filter_intra_selected_flag = 0;
  TX_SIZE best_tx_size = mbmi->tx_size;
  FILTER_INTRA_MODE best_fi_mode = FILTER_DC_PRED;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  memcpy(best_blk_skip, x->txfm_search_info.blk_skip,
         sizeof(best_blk_skip[0]) * ctx->num_4x4_blk);
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  av1_copy_array(best_tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
  mbmi->filter_intra_mode_info.use_filter_intra = 1;
  for (FILTER_INTRA_MODE fi_mode = FILTER_DC_PRED; fi_mode < FILTER_INTRA_MODES;
       ++fi_mode) {
    mbmi->filter_intra_mode_info.filter_intra_mode = fi_mode;
    av1_pick_uniform_tx_size_type_yrd(cpi, x, &rd_stats_y_fi, bsize, best_rd);
    if (rd_stats_y_fi.rate == INT_MAX) continue;
    const int this_rate_tmp =
        rd_stats_y_fi.rate +
        intra_mode_info_cost_y(cpi, x, mbmi, bsize, mode_cost, 0);
    const int64_t this_rd_tmp =
        RDCOST(x->rdmult, this_rate_tmp, rd_stats_y_fi.dist);

    if (this_rd_tmp != INT64_MAX && this_rd_tmp / 2 > best_rd) {
      break;
    }
    if (this_rd_tmp < best_rd_so_far) {
      best_tx_size = mbmi->tx_size;
      av1_copy_array(best_tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
      memcpy(best_blk_skip, x->txfm_search_info.blk_skip,
             sizeof(best_blk_skip[0]) * ctx->num_4x4_blk);
      best_fi_mode = fi_mode;
      *rd_stats_y = rd_stats_y_fi;
      filter_intra_selected_flag = 1;
      best_rd_so_far = this_rd_tmp;
    }
  }

  mbmi->tx_size = best_tx_size;
  av1_copy_array(xd->tx_type_map, best_tx_type_map, ctx->num_4x4_blk);
  memcpy(x->txfm_search_info.blk_skip, best_blk_skip,
         sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);

  if (filter_intra_selected_flag) {
    mbmi->filter_intra_mode_info.use_filter_intra = 1;
    mbmi->filter_intra_mode_info.filter_intra_mode = best_fi_mode;
  } else {
    mbmi->filter_intra_mode_info.use_filter_intra = 0;
  }
}